

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall
OpenMD::ReplicateVisitor::ReplicateVisitor(ReplicateVisitor *this,SimInfo *info,Vector3i *opt)

{
  int iVar1;
  int k;
  int iVar2;
  int j;
  int iVar3;
  Vector<double,_3U> local_48;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ReplicateVisitor_00288260;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->info = (SimInfo *)0x0;
  Vector<int,_3U>::Vector(&(this->replicateOpt).super_Vector<int,_3U>,&opt->super_Vector<int,_3U>);
  this->info = info;
  std::__cxx11::string::assign((char *)&(this->super_BaseVisitor).visitorName);
  for (iVar1 = 0; iVar1 <= (this->replicateOpt).super_Vector<int,_3U>.data_[0]; iVar1 = iVar1 + 1) {
    for (iVar3 = 0; iVar3 <= (this->replicateOpt).super_Vector<int,_3U>.data_[1]; iVar3 = iVar3 + 1)
    {
      for (iVar2 = 0; iVar2 <= (this->replicateOpt).super_Vector<int,_3U>.data_[2];
          iVar2 = iVar2 + 1) {
        if ((iVar3 != 0 || iVar1 != 0) || iVar2 != 0) {
          Vector<double,_3U>::Vector(&local_48);
          local_48.data_[0] = (double)iVar1;
          local_48.data_[1] = (double)iVar3;
          local_48.data_[2] = (double)iVar2;
          std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
          emplace_back<OpenMD::Vector3<double>>
                    ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                     &this->dir,(Vector3<double> *)&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

ReplicateVisitor::ReplicateVisitor(SimInfo* info, Vector3i opt) :
      BaseVisitor(), replicateOpt(opt) {
    this->info  = info;
    visitorName = "ReplicateVisitor";

    // generate the replicate directions
    for (int i = 0; i <= replicateOpt[0]; i++) {
      for (int j = 0; j <= replicateOpt[1]; j++) {
        for (int k = 0; k <= replicateOpt[2]; k++) {
          // skip original frame
          if (i == 0 && j == 0 && k == 0) {
            continue;
          } else {
            dir.push_back(Vector3d((RealType)i, (RealType)j, (RealType)k));
          }
        }
      }
    }
  }